

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemCopy(Mem *pTo,Mem *pFrom)

{
  ushort uVar1;
  sqlite3 *psVar2;
  char *pcVar3;
  double dVar4;
  anon_union_8_5_44880d43_for_u aVar5;
  _func_void_void_ptr *p_Var6;
  u16 uVar7;
  u8 uVar8;
  u8 uVar9;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  
  if ((pTo->flags & 0x2460) != 0) {
    sqlite3VdbeMemReleaseExternal(pTo);
  }
  psVar2 = pFrom->db;
  pcVar3 = pFrom->z;
  dVar4 = pFrom->r;
  aVar5 = pFrom->u;
  uVar7 = pFrom->flags;
  uVar8 = pFrom->type;
  uVar9 = pFrom->enc;
  p_Var6 = pFrom->xDel;
  pTo->n = pFrom->n;
  pTo->flags = uVar7;
  pTo->type = uVar8;
  pTo->enc = uVar9;
  pTo->xDel = p_Var6;
  pTo->r = dVar4;
  pTo->u = aVar5;
  pTo->db = psVar2;
  pTo->z = pcVar3;
  uVar1 = pTo->flags;
  uVar11 = uVar1 & 0xfbff;
  uVar10 = (ushort)uVar11;
  pTo->flags = uVar10;
  if (((uVar1 & 0x12) != 0) && ((pFrom->flags & 0x800) == 0)) {
    pTo->flags = uVar10 | 0x1000;
    iVar12 = sqlite3VdbeMemMakeWriteable(pTo);
    return iVar12;
  }
  return uVar11;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemCopy(Mem *pTo, const Mem *pFrom){
  int rc = SQLITE_OK;

  assert( (pFrom->flags & MEM_RowSet)==0 );
  VdbeMemRelease(pTo);
  memcpy(pTo, pFrom, MEMCELLSIZE);
  pTo->flags &= ~MEM_Dyn;

  if( pTo->flags&(MEM_Str|MEM_Blob) ){
    if( 0==(pFrom->flags&MEM_Static) ){
      pTo->flags |= MEM_Ephem;
      rc = sqlite3VdbeMemMakeWriteable(pTo);
    }
  }

  return rc;
}